

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

char * google::glog_internal_namespace_::ProgramInvocationShortName(void)

{
  undefined8 local_10;
  
  if (g_program_invocation_short_name == (char *)0x0) {
    local_10 = _program_invocation_short_name;
  }
  else {
    local_10 = g_program_invocation_short_name;
  }
  return local_10;
}

Assistant:

const char* ProgramInvocationShortName() {
  if (g_program_invocation_short_name != nullptr) {
    return g_program_invocation_short_name;
  }
#if defined(HAVE_PROGRAM_INVOCATION_SHORT_NAME)
  return program_invocation_short_name;
#elif defined(HAVE_GETPROGNAME)
  return getprogname();
#elif defined(HAVE___PROGNAME)
  return __progname;
#elif defined(HAVE___ARGV)
  return const_basename(__argv[0]);
#else
  return "UNKNOWN";
#endif
}